

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

string * __thiscall Args::CmdLine::value(CmdLine *this,String *name)

{
  int iVar1;
  ArgIface *pAVar2;
  String *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *in_RDI;
  ArgIface *arg;
  uint in_stack_ffffffffffffffc8;
  
  pAVar2 = findArgument(this,name);
  if (pAVar2 == (ArgIface *)0x0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    iVar1 = (*pAVar2->_vptr_ArgIface[2])();
    if (iVar1 == 0) {
      pSVar3 = Command::value_abi_cxx11_((Command *)(ulong)in_stack_ffffffffffffffc8);
      std::__cxx11::string::string(in_RDI,(string *)pSVar3);
    }
    else if (iVar1 == 1) {
      iVar1 = (*pAVar2->_vptr_ArgIface[0x13])();
      std::__cxx11::string::string(in_RDI,(string *)CONCAT44(extraout_var,iVar1));
    }
    else if (iVar1 == 2) {
      iVar1 = (*pAVar2->_vptr_ArgIface[0x13])();
      std::__cxx11::string::string(in_RDI,(string *)CONCAT44(extraout_var_00,iVar1));
    }
    else {
      std::__cxx11::string::string(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

String value(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->value() );

				case ArgType::Arg :
					return ( static_cast< const Arg* > ( arg )->value() );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->value() );

				default :
					return String();
			}
		}
		else
			return String();
	}